

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgUtils.cpp
# Opt level: O3

VariableType *
rsg::computeRandomType(VariableType *__return_storage_ptr__,GeneratorState *state,int maxScalars)

{
  Type TVar1;
  deUint32 dVar2;
  runtime_error *this;
  uint uVar3;
  Type baseType;
  Type local_44;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  local_44 = TYPE_LAST;
  de::Random::choose<rsg::VariableType::Type_const*,rsg::VariableType::Type*>
            (state->m_random,computeRandomType::baseTypes,(Type *)"Invalid type",&local_44,1);
  TVar1 = local_44;
  if (local_44 - TYPE_FLOAT < 3) {
    uVar3 = 4;
    if (maxScalars < 4) {
      uVar3 = maxScalars;
    }
    dVar2 = deRandom_getUint32(&state->m_random->m_rnd);
    __return_storage_ptr__->m_baseType = TVar1;
    __return_storage_ptr__->m_precision = PRECISION_NONE;
    (__return_storage_ptr__->m_typeName)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_typeName).field_2;
    (__return_storage_ptr__->m_typeName)._M_string_length = 0;
    (__return_storage_ptr__->m_typeName).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->m_numElements = dVar2 % uVar3 + 1;
    __return_storage_ptr__->m_elementType = (VariableType *)0x0;
    (__return_storage_ptr__->m_members).
    super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->m_members).
    super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->m_members).
    super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    return __return_storage_ptr__;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"computeRandomType(): Unsupported type","");
  std::runtime_error::runtime_error(this,(string *)local_40);
  *(undefined ***)this = &PTR__runtime_error_0018bb18;
  __cxa_throw(this,&Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

VariableType computeRandomType (GeneratorState& state, int maxScalars)
{
	DE_ASSERT(maxScalars >= 1);

	static const VariableType::Type baseTypes[] =
	{
		VariableType::TYPE_BOOL,
		VariableType::TYPE_INT,
		VariableType::TYPE_FLOAT
		// \todo [pyry] Other types
	};

	VariableType::Type baseType = VariableType::TYPE_LAST;
	state.getRandom().choose(baseTypes, baseTypes + DE_LENGTH_OF_ARRAY(baseTypes), &baseType, 1);

	switch (baseType)
	{
		case VariableType::TYPE_BOOL:
		case VariableType::TYPE_INT:
		case VariableType::TYPE_FLOAT:
		{
			const int minVecLength = 1;
			const int maxVecLength = 4;
			return VariableType(baseType, state.getRandom().getInt(minVecLength, de::min(maxScalars, maxVecLength)));
		}

		default:
			DE_ASSERT(DE_FALSE);
			throw Exception("computeRandomType(): Unsupported type");
	}
}